

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlChar * xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,xmlChar *prefix)

{
  xmlSchemaNodeInfoPtr pxVar1;
  xmlNodePtr node;
  bool bVar2;
  int iVar3;
  xmlChar *name;
  xmlChar *pxVar4;
  xmlNsPtr pxVar5;
  long lVar6;
  xmlChar *in_R8;
  long lVar7;
  
  if (vctxt->sax == (xmlSAXHandlerPtr)0x0) {
    if (vctxt->reader == (xmlTextReaderPtr)0x0) {
      node = vctxt->inode->node;
      if ((node == (xmlNodePtr)0x0) || (node->doc == (xmlDocPtr)0x0)) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaLookupNamespace",
                   "no node or node\'s doc available",(xmlChar *)0x0,in_R8);
        return (xmlChar *)0x0;
      }
      pxVar5 = xmlSearchNs(node->doc,node,prefix);
      if (pxVar5 != (xmlNsPtr)0x0) {
        return pxVar5->href;
      }
    }
    else {
      name = xmlTextReaderLookupNamespace(vctxt->reader,prefix);
      if (name != (xmlChar *)0x0) {
        pxVar4 = xmlDictLookup(vctxt->dict,name,-1);
        (*xmlFree)(name);
        return pxVar4;
      }
    }
  }
  else {
    lVar7 = (long)vctxt->depth;
    if (-1 < lVar7) {
      do {
        pxVar1 = vctxt->elemInfos[lVar7];
        if ((pxVar1->nbNsBindings != 0) && (0 < pxVar1->nbNsBindings)) {
          lVar6 = 0;
          do {
            if (prefix == (xmlChar *)0x0) {
              if (pxVar1->nsBindings[lVar6] == (xmlChar *)0x0) {
LAB_001ca6fe:
                return pxVar1->nsBindings[lVar6 + 1];
              }
            }
            else {
              iVar3 = xmlStrEqual(prefix,pxVar1->nsBindings[lVar6]);
              if (iVar3 != 0) goto LAB_001ca6fe;
            }
            lVar6 = lVar6 + 2;
          } while (SBORROW8(lVar6,(long)pxVar1->nbNsBindings * 2) !=
                   lVar6 + (long)pxVar1->nbNsBindings * -2 < 0);
        }
        bVar2 = lVar7 < 1;
        lVar7 = lVar7 + -1;
        if (bVar2) {
          return (xmlChar *)0x0;
        }
      } while( true );
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,
			 const xmlChar *prefix)
{
    if (vctxt->sax != NULL) {
	int i, j;
	xmlSchemaNodeInfoPtr inode;

	for (i = vctxt->depth; i >= 0; i--) {
	    if (vctxt->elemInfos[i]->nbNsBindings != 0) {
		inode = vctxt->elemInfos[i];
		for (j = 0; j < inode->nbNsBindings * 2; j += 2) {
		    if (((prefix == NULL) &&
			    (inode->nsBindings[j] == NULL)) ||
			((prefix != NULL) && xmlStrEqual(prefix,
			    inode->nsBindings[j]))) {

			/*
			* Note that the namespace bindings are already
			* in a string dict.
			*/
			return (inode->nsBindings[j+1]);
		    }
		}
	    }
	}
	return (NULL);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	xmlChar *nsName;

	nsName = xmlTextReaderLookupNamespace(vctxt->reader, prefix);
	if (nsName != NULL) {
	    const xmlChar *ret;

	    ret = xmlDictLookup(vctxt->dict, nsName, -1);
	    xmlFree(nsName);
	    return (ret);
	} else
	    return (NULL);
#endif
    } else {
	xmlNsPtr ns;

	if ((vctxt->inode->node == NULL) ||
	    (vctxt->inode->node->doc == NULL)) {
	    VERROR_INT("xmlSchemaLookupNamespace",
		"no node or node's doc available");
	    return (NULL);
	}
	ns = xmlSearchNs(vctxt->inode->node->doc,
	    vctxt->inode->node, prefix);
	if (ns != NULL)
	    return (ns->href);
	return (NULL);
    }
}